

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O2

int Saig_ManCexRefineStep
              (Aig_Man_t *p,Vec_Int_t *vFlops,Vec_Int_t *vFlopClasses,Abc_Cex_t *pCex,
              int nFfToAddMax,int fTryFour,int fSensePath,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Aig_Man_t *pAbs;
  Vec_Int_t *vAbsFfsToAdd;
  abctime aVar5;
  Abc_Cex_t *pAVar6;
  Vec_Int_t *p_00;
  int iVar7;
  
  aVar4 = Abc_Clock();
  pAbs = Saig_ManDupAbstraction(p,vFlops);
  iVar2 = Saig_ManCexFirstFlopPi(p,pAbs);
  if (fSensePath == 0) {
    vAbsFfsToAdd = Saig_ManExtendCounterExampleTest3(pAbs,iVar2,pCex,fVerbose);
  }
  else {
    vAbsFfsToAdd = Saig_ManExtendCounterExampleTest2(pAbs,iVar2,pCex,fVerbose);
  }
  if (vAbsFfsToAdd == (Vec_Int_t *)0x0) {
    iVar2 = 0;
  }
  else {
    uVar1 = vAbsFfsToAdd->nSize;
    if (uVar1 == 0) {
      puts("Refinement did not happen. Discovered a true counter-example.");
      iVar2 = 0;
      printf("Remapping counter-example from %d to %d primary inputs.\n",(ulong)(uint)pAbs->nObjs[2]
             ,(ulong)(uint)p->nObjs[2]);
      pAVar6 = Saig_ManCexRemap(p,pAbs,pCex);
      p->pSeqModel = pAVar6;
    }
    else {
      if (fVerbose != 0) {
        iVar2 = 0x833f5b;
        printf("Adding %d registers to the abstraction (total = %d).  ",(ulong)uVar1,
               (ulong)(p->nRegs + uVar1));
        aVar5 = Abc_Clock();
        Abc_Print(iVar2,"%s =","Time");
        Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar5 - aVar4) / 1000000.0);
      }
      p_00 = vAbsFfsToAdd;
      if ((0 < nFfToAddMax) && (iVar2 = vAbsFfsToAdd->nSize, nFfToAddMax < iVar2)) {
        for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
          Vec_IntEntry(vAbsFfsToAdd,iVar7);
          Vec_IntAddToEntry(vAbsFfsToAdd,iVar7,-p->nTruePis);
          iVar2 = vAbsFfsToAdd->nSize;
        }
        p_00 = Saig_ManCbaFilterFlops(p,pCex,vFlopClasses,vAbsFfsToAdd,nFfToAddMax);
        if (p_00->nSize != nFfToAddMax) {
          __assert_fail("Vec_IntSize(vFlopsNewBest) == nFfToAddMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                        ,0x128,
                        "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                       );
        }
        printf("Filtering flops based on cost (%d -> %d).\n",(ulong)(uint)vAbsFfsToAdd->nSize,
               (ulong)(uint)nFfToAddMax);
        Vec_IntFree(vAbsFfsToAdd);
        for (iVar2 = 0; iVar2 < p_00->nSize; iVar2 = iVar2 + 1) {
          Vec_IntEntry(p_00,iVar2);
          Vec_IntAddToEntry(p_00,iVar2,p->nTruePis);
        }
      }
      iVar2 = 1;
      for (iVar7 = 0; vAbsFfsToAdd = p_00, iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
        iVar3 = Vec_IntEntry(p_00,iVar7);
        iVar3 = Vec_IntEntry(pAbs->vCiNumsOrig,iVar3);
        if (iVar3 < p->nTruePis) {
          __assert_fail("Entry >= Saig_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                        ,0x135,
                        "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                       );
        }
        if (p->nObjs[2] <= iVar3) {
          __assert_fail("Entry < Aig_ManCiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                        ,0x136,
                        "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                       );
        }
        Vec_IntPush(vFlops,iVar3 - p->nTruePis);
      }
    }
    Vec_IntFree(vAbsFfsToAdd);
  }
  Aig_ManStop(pAbs);
  return iVar2;
}

Assistant:

int Saig_ManCexRefineStep( Aig_Man_t * p, Vec_Int_t * vFlops, Vec_Int_t * vFlopClasses, Abc_Cex_t * pCex, int nFfToAddMax, int fTryFour, int fSensePath, int fVerbose )
{
    Aig_Man_t * pAbs;
    Vec_Int_t * vFlopsNew;
    int i, Entry;
    abctime clk = Abc_Clock();
    pAbs = Saig_ManDupAbstraction( p, vFlops );
    if ( fSensePath )
        vFlopsNew = Saig_ManExtendCounterExampleTest2( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fVerbose );
    else
//        vFlopsNew = Saig_ManExtendCounterExampleTest( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fTryFour, fVerbose );
        vFlopsNew = Saig_ManExtendCounterExampleTest3( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fVerbose );
    if ( vFlopsNew == NULL )
    {
        Aig_ManStop( pAbs );
        return 0;
    }
    if ( Vec_IntSize(vFlopsNew) == 0 )
    {
        printf( "Refinement did not happen. Discovered a true counter-example.\n" );
        printf( "Remapping counter-example from %d to %d primary inputs.\n", Aig_ManCiNum(pAbs), Aig_ManCiNum(p) );
        p->pSeqModel = Saig_ManCexRemap( p, pAbs, pCex );
        Vec_IntFree( vFlopsNew );
        Aig_ManStop( pAbs );
        return 0;
    }
    if ( fVerbose )
    {
        printf( "Adding %d registers to the abstraction (total = %d).  ", Vec_IntSize(vFlopsNew), Aig_ManRegNum(p)+Vec_IntSize(vFlopsNew) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    // vFlopsNew contains PI numbers that should be kept in pAbs
    // select the most useful flops among those to be added
    if ( nFfToAddMax > 0 && Vec_IntSize(vFlopsNew) > nFfToAddMax )
    {
        Vec_Int_t * vFlopsNewBest;
        // shift the indices
        Vec_IntForEachEntry( vFlopsNew, Entry, i )
            Vec_IntAddToEntry( vFlopsNew, i, -Saig_ManPiNum(p) );
        // create new flops
        vFlopsNewBest = Saig_ManCbaFilterFlops( p, pCex, vFlopClasses, vFlopsNew, nFfToAddMax );
        assert( Vec_IntSize(vFlopsNewBest) == nFfToAddMax );
        printf( "Filtering flops based on cost (%d -> %d).\n", Vec_IntSize(vFlopsNew), Vec_IntSize(vFlopsNewBest) );
        // update
        Vec_IntFree( vFlopsNew );
        vFlopsNew = vFlopsNewBest;
        // shift the indices
        Vec_IntForEachEntry( vFlopsNew, Entry, i )
            Vec_IntAddToEntry( vFlopsNew, i, Saig_ManPiNum(p) );
    }
    // add to the abstraction
    Vec_IntForEachEntry( vFlopsNew, Entry, i )
    {
        Entry = Vec_IntEntry(pAbs->vCiNumsOrig, Entry);
        assert( Entry >= Saig_ManPiNum(p) );
        assert( Entry < Aig_ManCiNum(p) );
        Vec_IntPush( vFlops, Entry-Saig_ManPiNum(p) );
    }
    Vec_IntFree( vFlopsNew );
    Aig_ManStop( pAbs );
    return 1;
}